

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FieldGeneratorMap::FieldGeneratorMap
          (FieldGeneratorMap *this,Descriptor *descriptor,Options *options)

{
  ulong __n;
  ulong *puVar1;
  scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator> *this_00;
  FieldGenerator *p;
  long lVar2;
  ulong uVar3;
  int i;
  long i_00;
  ulong uVar4;
  
  this->descriptor_ = descriptor;
  this->options_ = options;
  uVar4 = (ulong)*(int *)(descriptor + 0x2c);
  __n = uVar4 * 8;
  uVar3 = __n + 8;
  if (0xfffffffffffffff7 < __n) {
    uVar3 = 0xffffffffffffffff;
  }
  if ((long)uVar4 < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  puVar1 = (ulong *)operator_new__(uVar3);
  *puVar1 = uVar4;
  if (uVar4 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator> *)(puVar1 + 1),0,__n);
  }
  (this->field_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator> *)(puVar1 + 1);
  lVar2 = 0;
  for (i_00 = 0; i_00 < (int)uVar4; i_00 = i_00 + 1) {
    this_00 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator>_>
              ::operator[](&this->field_generators_,i_00);
    p = MakeGenerator((FieldDescriptor *)(*(long *)(descriptor + 0x30) + lVar2),options);
    internal::scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator>::reset(this_00,p);
    uVar4 = (ulong)*(uint *)(descriptor + 0x2c);
    lVar2 = lVar2 + 0xa8;
  }
  return;
}

Assistant:

FieldGeneratorMap::FieldGeneratorMap(const Descriptor* descriptor,
                                     const Options& options)
    : descriptor_(descriptor),
      options_(options),
      field_generators_(
          new google::protobuf::scoped_ptr<FieldGenerator>[descriptor->field_count()]) {
  // Construct all the FieldGenerators.
  for (int i = 0; i < descriptor->field_count(); i++) {
    field_generators_[i].reset(MakeGenerator(descriptor->field(i), options));
  }
}